

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

void __thiscall
miniros::Subscription::pendingConnectionDone
          (Subscription *this,PendingConnectionPtr *conn,XmlRpcValue *result)

{
  uint uVar1;
  uint uVar2;
  XmlRpcClient *pXVar3;
  pointer pcVar4;
  element_type *peVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  RPCManager *this_01;
  pointer pcVar7;
  void *pvVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  RPCManagerPtr *pRVar12;
  XmlRpcValue *pXVar13;
  PollManagerPtr *pPVar14;
  ulong uVar15;
  ConnectionManagerPtr *pCVar16;
  socklen_t __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  sockaddr *__addr;
  pair<std::_Rb_tree_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::_Rb_tree_iterator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  pVar18;
  ConnectionPtr connection_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  string proto_name;
  XmlRpcValue proto;
  string err;
  string pub_host;
  string error_msg;
  vector<char,_std::allocator<char>_> header_bytes;
  shared_ptr<unsigned_char[]> buffer;
  Header h;
  ConnectionPtr connection;
  TransportPublisherLinkPtr pub_link;
  string peer_host;
  TransportPtr local_1e8;
  string xmlrpc_uri;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->shutdown_mutex_);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  if ((this->shutting_down_ != false) || (this->dropped_ != false)) goto LAB_0020c29f;
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->pending_connections_mutex_);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  pVar18 = std::
           _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
           ::equal_range(&(this->pending_connections_)._M_t,conn);
  std::
  _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::_M_erase_aux(&(this->pending_connections_)._M_t,(_Base_ptr)pVar18.first._M_node,
                 (_Base_ptr)pVar18.second._M_node);
  pthread_mutex_unlock((pthread_mutex_t *)&this->pending_connections_mutex_);
  pXVar3 = ((conn->
            super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->client_;
  peer_host._M_dataplus._M_p = (pointer)&peer_host.field_2;
  pcVar4 = (pXVar3->_host)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peer_host,pcVar4,pcVar4 + (pXVar3->_host)._M_string_length);
  uVar1 = ((conn->
           super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->client_->_port;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"http://",7);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,peer_host._M_dataplus._M_p,peer_host._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,":",1);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
  std::__cxx11::stringbuf::str();
  peVar5 = (conn->
           super___shared_ptr<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  peVar6 = (peVar5->udp_transport_).
           super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar5->udp_transport_).
            super___shared_ptr<miniros::TransportUDP,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  proto._type = TypeInvalid;
  proto._value.asDouble = 0.0;
  pRVar12 = RPCManager::instance();
  this_01 = (pRVar12->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  proto_name._M_dataplus._M_p = (pointer)&proto_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&proto_name,"requestTopic","");
  bVar9 = RPCManager::validateXmlrpcResponse(this_01,&proto_name,result,&proto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proto_name._M_dataplus._M_p != &proto_name.field_2) {
    operator_delete(proto_name._M_dataplus._M_p,proto_name.field_2._M_allocated_capacity + 1);
  }
  if (bVar9) {
    iVar10 = XmlRpc::XmlRpcValue::size(&proto);
    if (iVar10 == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        proto_name._M_dataplus._M_p = (pointer)&proto_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&proto_name,"miniros.subscription","");
        console::initializeLogLocation
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,&proto_name,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)proto_name._M_dataplus._M_p != &proto_name.field_2) {
          operator_delete(proto_name._M_dataplus._M_p,proto_name.field_2._M_allocated_capacity + 1);
        }
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1dc,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Couldn\'t agree on any common protocols with [%s] for topic [%s]",
                       xmlrpc_uri._M_dataplus._M_p,(this->name_)._M_dataplus._M_p);
      }
      goto LAB_0020c20d;
    }
    if (proto._type != TypeArray) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        proto_name._M_dataplus._M_p = (pointer)&proto_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&proto_name,"miniros.subscription","");
        console::initializeLogLocation
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,&proto_name,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)proto_name._M_dataplus._M_p != &proto_name.field_2) {
          operator_delete(proto_name._M_dataplus._M_p,proto_name.field_2._M_allocated_capacity + 1);
        }
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1e3,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Available protocol info returned from %s is not a list.",
                       xmlrpc_uri._M_dataplus._M_p);
      }
      goto LAB_0020c20d;
    }
    pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,0);
    if (pXVar13->_type != TypeString) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        proto_name._M_dataplus._M_p = (pointer)&proto_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&proto_name,"miniros.subscription","");
        console::initializeLogLocation
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,&proto_name,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)proto_name._M_dataplus._M_p != &proto_name.field_2) {
          operator_delete(proto_name._M_dataplus._M_p,proto_name.field_2._M_allocated_capacity + 1);
        }
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc,Debug);
        console::checkLogLocationEnabled
                  (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_,
                       pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1e9,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Available protocol info list doesn\'t have a string as its first element.")
        ;
      }
      goto LAB_0020c20d;
    }
    pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,0);
    XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeString);
    paVar17 = &proto_name.field_2;
    pcVar7 = (((pXVar13->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    proto_name._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&proto_name,pcVar7,
               (((pXVar13->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
               _M_impl.super__Vector_impl_data._M_finish + (long)pcVar7);
    __len = (socklen_t)paVar17;
    iVar10 = std::__cxx11::string::compare((char *)&proto_name);
    if (iVar10 == 0) {
      iVar10 = XmlRpc::XmlRpcValue::size(&proto);
      if (((iVar10 == 3) &&
          (pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,1), pXVar13->_type == TypeString)) &&
         (pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,2), pXVar13->_type == TypeInt)) {
        pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,1);
        XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeString);
        pcVar7 = (((pXVar13->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pub_host._M_dataplus._M_p = (pointer)&pub_host.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pub_host,pcVar7,
                   (((pXVar13->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + (long)pcVar7);
        pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,2);
        XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeInt);
        __addr = (sockaddr *)(ulong)(uint)(pXVar13->_value).asInt;
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          err._M_dataplus._M_p = (pointer)&err.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&err,"miniros.subscription","");
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&err,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)err._M_dataplus._M_p != &err.field_2) {
            operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
          }
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          __len = 0x25b7bb;
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x1fb,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"Connecting via tcpros to topic [%s] at host [%s:%d]",
                         (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,__addr);
        }
        pPVar14 = PollManager::instance();
        err._M_dataplus._M_p =
             (pointer)(pPVar14->super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
        std::__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<miniros::TransportTCP>,miniros::PollSet*>
                  ((__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2> *)&error_msg,
                   (allocator<miniros::TransportTCP> *)&connection_1,(PollSet **)&err);
        iVar10 = TransportTCP::connect
                           ((TransportTCP *)error_msg._M_dataplus._M_p,(int)&pub_host,__addr,__len);
        if ((char)iVar10 == '\0') {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ == false) {
            err._M_dataplus._M_p = (pointer)&err.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&err,"miniros.subscription","");
            console::initializeLogLocation
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,&err,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err._M_dataplus._M_p != &err.field_2) {
              operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
            }
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x20f,
                           "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                           ,"Failed to connect to publisher of topic [%s] at [%s:%d]",
                           (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,__addr);
          }
        }
        else {
          std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<miniros::Connection>>
                    ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)&connection_1,
                     (allocator<miniros::Connection> *)&err);
          std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<miniros::Subscription,void>
                    ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)&err,
                     (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<miniros::Subscription>);
          std::__shared_ptr<miniros::TransportPublisherLink,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<miniros::TransportPublisherLink>,std::shared_ptr<miniros::Subscription>,std::__cxx11::string&,miniros::TransportHints&>
                    ((__shared_ptr<miniros::TransportPublisherLink,(__gnu_cxx::_Lock_policy)2> *)
                     &header_bytes,(allocator<miniros::TransportPublisherLink> *)&buffer,
                     (shared_ptr<miniros::Subscription> *)&err,&xmlrpc_uri,&this->transport_hints_);
          if (err._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err._M_string_length);
          }
          buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)error_msg._M_dataplus._M_p;
          buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_msg._M_string_length;
          if (error_msg._M_string_length != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(error_msg._M_string_length + 8) =
                   *(int *)(error_msg._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(error_msg._M_string_length + 8) =
                   *(int *)(error_msg._M_string_length + 8) + 1;
            }
          }
          err.field_2._M_allocated_capacity = 0;
          err.field_2._8_8_ = 0;
          err._M_dataplus._M_p = (pointer)0x0;
          err._M_string_length = 0;
          Connection::initialize
                    (connection_1.
                     super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (TransportPtr *)&buffer,false,(HeaderReceivedFunc *)&err);
          if (err.field_2._M_allocated_capacity != 0) {
            (*(code *)err.field_2._M_allocated_capacity)(&err,&err,3);
          }
          if (buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          TransportPublisherLink::initialize
                    ((TransportPublisherLink *)
                     CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start),&connection_1);
          pCVar16 = ConnectionManager::instance();
          ConnectionManager::addConnection
                    ((pCVar16->
                     super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,&connection_1);
          iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->publisher_links_mutex_);
          if (iVar10 != 0) {
            std::__throw_system_error(iVar10);
          }
          err._M_dataplus._M_p =
               (pointer)CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          err._M_string_length =
               CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish._4_4_,
                        (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish);
          if (err._M_string_length != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(err._M_string_length + 8) = *(int *)(err._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(err._M_string_length + 8) = *(int *)(err._M_string_length + 8) + 1;
            }
          }
          std::
          vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
          ::push_back(&this->publisher_links_,(value_type *)&err);
          if (err._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err._M_string_length);
          }
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ == false) {
            err._M_dataplus._M_p = (pointer)&err.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&err,"miniros.subscription","");
            console::initializeLogLocation
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,&err,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err._M_dataplus._M_p != &err.field_2) {
              operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
            }
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x20b,
                           "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                           ,"Connected to publisher of topic [%s] at [%s:%d]",
                           (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,__addr);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish._4_4_,
                       (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                .super__Vector_impl_data._M_finish._4_4_,
                                (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish));
          }
          if (connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (connection_1.
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (error_msg._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_msg._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pub_host._M_dataplus._M_p != &pub_host.field_2) {
LAB_0020ca23:
          operator_delete(pub_host._M_dataplus._M_p,pub_host.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          pub_host._M_dataplus._M_p = (pointer)&pub_host.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&pub_host,"miniros.subscription","");
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&pub_host,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pub_host._M_dataplus._M_p != &pub_host.field_2) {
            operator_delete(pub_host._M_dataplus._M_p,pub_host.field_2._M_allocated_capacity + 1);
          }
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x1f6,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"publisher implements TCPROS, but the parameters aren\'t string,int");
        }
      }
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)&proto_name);
      if (iVar10 == 0) {
        iVar10 = XmlRpc::XmlRpcValue::size(&proto);
        if ((((iVar10 == 6) &&
             (pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,1), pXVar13->_type == TypeString)) &&
            ((pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,2), pXVar13->_type == TypeInt &&
             ((pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,3), pXVar13->_type == TypeInt &&
              (pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,4), pXVar13->_type == TypeInt))))))
           && (pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,5), pXVar13->_type == TypeBase64)) {
          pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,1);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeString);
          pub_host._M_dataplus._M_p = (pointer)&pub_host.field_2;
          pcVar7 = (((pXVar13->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pub_host,pcVar7,
                     (((pXVar13->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)
                     ._M_impl.super__Vector_impl_data._M_finish + (long)pcVar7);
          pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,2);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeInt);
          uVar15 = (ulong)(uint)(pXVar13->_value).asInt;
          pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,3);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeInt);
          uVar1 = (pXVar13->_value).asInt;
          pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,4);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeInt);
          uVar2 = (pXVar13->_value).asInt;
          pXVar13 = XmlRpc::XmlRpcValue::operator[](&proto,5);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar13,TypeBase64);
          std::vector<char,_std::allocator<char>_>::vector
                    (&header_bytes,(vector<char,_std::allocator<char>_> *)(pXVar13->_value).asTime);
          buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               operator_new__(CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)header_bytes.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_finish) -
                              CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)header_bytes.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_start));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<unsigned_char*,std::__sp_array_delete,std::allocator<void>,void>
                    (&buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          memcpy(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (void *)CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start),
                 CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish._4_4_,
                          (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish) -
                 (long)CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                .super__Vector_impl_data._M_start._4_4_,
                                (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
          Header::Header(&h);
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00
          ;
          bVar9 = Header::parse(&h,&buffer,
                                (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                                (int)header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start,&err);
          if (bVar9) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ == false) {
              error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_msg,"miniros.subscription","");
              console::initializeLogLocation
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,&error_msg,Debug);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
                operator_delete(error_msg._M_dataplus._M_p,
                                CONCAT71(error_msg.field_2._M_allocated_capacity._1_7_,
                                         error_msg.field_2._M_local_buf[0]) + 1);
              }
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,Debug);
              console::checkLogLocationEnabled
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                             ,0x22f,
                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                             ,
                             "Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]"
                             ,(this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,uVar15,
                             (ulong)uVar1,(ulong)uVar2);
            }
            error_msg._M_string_length = 0;
            error_msg.field_2._M_local_buf[0] = '\0';
            connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)&local_318;
            error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&connection_1,"error","");
            bVar9 = Header::getValue(&h,(string *)&connection_1,&error_msg);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != &local_318) {
              operator_delete(connection_1.
                              super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(ulong)(local_318._M_allocated_capacity + 1));
            }
            if (bVar9) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.initialized_ == false) {
                connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)&local_318;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&connection_1,"miniros.subscription","");
                console::initializeLogLocation
                          (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc,(string *)&connection_1,Debug);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)connection_1.
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    &local_318) {
                  operator_delete(connection_1.
                                  super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(ulong)(local_318._M_allocated_capacity + 1));
                }
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.level_ != Debug) {
                console::setLogLocationLevel
                          (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc,Debug);
                console::checkLogLocationEnabled
                          (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc);
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                               ::loc.logger_,
                               pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                               ,0x234,
                               "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                               ,"Received error message in header for connection to [%s]: [%s]",
                               xmlrpc_uri._M_dataplus._M_p,error_msg._M_dataplus._M_p);
              }
              if (peVar6 != (element_type *)0x0) {
                (*(peVar6->super_Transport)._vptr_Transport[8])(peVar6);
              }
            }
            else {
              std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<miniros::Subscription,void>
                        ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)
                         &connection_1,
                         (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
                         &this->super_enable_shared_from_this<miniros::Subscription>);
              std::__shared_ptr<miniros::TransportPublisherLink,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<miniros::TransportPublisherLink>,std::shared_ptr<miniros::Subscription>,std::__cxx11::string&,miniros::TransportHints&>
                        ((__shared_ptr<miniros::TransportPublisherLink,(__gnu_cxx::_Lock_policy)2> *
                         )&pub_link,(allocator<miniros::TransportPublisherLink> *)&connection,
                         (shared_ptr<miniros::Subscription> *)&connection_1,&xmlrpc_uri,
                         &this->transport_hints_);
              if (connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (connection_1.
                           super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              bVar9 = PublisherLink::setHeader
                                (&(pub_link.
                                   super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_PublisherLink,&h);
              if (bVar9) {
                std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<miniros::Connection>>
                          ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)
                           &connection,(allocator<miniros::Connection> *)&connection_1);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                local_318._M_allocated_capacity = 0;
                local_318._8_8_ = 0;
                connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_1e8.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = &peVar6->super_Transport;
                local_1e8.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = this_00;
                Connection::initialize
                          (connection.
                           super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,&local_1e8,false,(HeaderReceivedFunc *)&connection_1);
                if ((code *)local_318._M_allocated_capacity != (code *)0x0) {
                  (*(code *)local_318._M_allocated_capacity)(&connection_1,&connection_1,3);
                }
                if (local_1e8.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_1e8.
                             super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                ((connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->header_).read_map_.
                super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = h.read_map_.
                          super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&((connection.
                              super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->header_).read_map_.
                            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           &h.read_map_.
                            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                TransportPublisherLink::initialize
                          (pub_link.
                           super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&connection);
                pCVar16 = ConnectionManager::instance();
                ConnectionManager::addConnection
                          ((pCVar16->
                           super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&connection);
                iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->publisher_links_mutex_);
                if (iVar10 != 0) {
                  std::__throw_system_error(iVar10);
                }
                connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         pub_link.
                         super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount = pub_link.
                              super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                if (pub_link.
                    super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (pub_link.
                     super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (pub_link.
                          super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (pub_link.
                     super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (pub_link.
                          super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                std::
                vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ::push_back(&this->publisher_links_,(value_type *)&connection_1);
                if (connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (connection_1.
                             super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (console::g_initialized == '\0') {
                  console::initialize();
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.initialized_ == false) {
                  connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)&local_318;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&connection_1,"miniros.subscription","");
                  console::initializeLogLocation
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,(string *)&connection_1,Debug);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)connection_1.
                         super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      != &local_318) {
                    operator_delete(connection_1.
                                    super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)(local_318._M_allocated_capacity + 1));
                  }
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.level_ != Debug) {
                  console::setLogLocationLevel
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,Debug);
                  console::checkLogLocationEnabled
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc);
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.logger_enabled_ == true) {
                  console::print((FilterBase *)0x0,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.level_,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                 ,0x246,
                                 "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                 ,"Connected to publisher of topic [%s] at [%s:%d]",
                                 (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,uVar15);
                }
                pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
                if (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (connection.
                             super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
              else {
                if (console::g_initialized == '\0') {
                  console::initialize();
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.initialized_ == false) {
                  connection_1.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)&local_318;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&connection_1,"miniros.subscription","");
                  console::initializeLogLocation
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,(string *)&connection_1,Debug);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)connection_1.
                         super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      != &local_318) {
                    operator_delete(connection_1.
                                    super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)(local_318._M_allocated_capacity + 1));
                  }
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.level_ != Debug) {
                  console::setLogLocationLevel
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc,Debug);
                  console::checkLogLocationEnabled
                            (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc);
                }
                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.logger_enabled_ == true) {
                  console::print((FilterBase *)0x0,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_,
                                 pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.level_,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                 ,0x24a,
                                 "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                 ,"Failed to connect to publisher of topic [%s] at [%s:%d]",
                                 (this->name_)._M_dataplus._M_p,pub_host._M_dataplus._M_p,uVar15);
                }
                if (peVar6 != (element_type *)0x0) {
                  (*(peVar6->super_Transport)._vptr_Transport[8])(peVar6);
                }
              }
              if (pub_link.
                  super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (pub_link.
                           super___shared_ptr<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
              operator_delete(error_msg._M_dataplus._M_p,
                              CONCAT71(error_msg.field_2._M_allocated_capacity._1_7_,
                                       error_msg.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err._M_dataplus._M_p != &err.field_2) {
              operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
            }
            Header::~Header(&h);
          }
          else {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ == false) {
              error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_msg,"miniros.subscription","");
              console::initializeLogLocation
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,&error_msg,Debug);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_msg._M_dataplus._M_p != &error_msg.field_2) {
                operator_delete(error_msg._M_dataplus._M_p,
                                CONCAT71(error_msg.field_2._M_allocated_capacity._1_7_,
                                         error_msg.field_2._M_local_buf[0]) + 1);
              }
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc,Debug);
              console::checkLogLocationEnabled
                        (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                             ,0x22b,
                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                             ,"Unable to parse UDPROS connection header: %s",err._M_dataplus._M_p);
            }
            if (peVar6 != (element_type *)0x0) {
              (*(peVar6->super_Transport)._vptr_Transport[8])(peVar6);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err._M_dataplus._M_p != &err.field_2) {
              operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
            }
            Header::~Header(&h);
          }
          if (buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pvVar8 = (void *)CONCAT44(header_bytes.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)header_bytes.
                                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                         super__Vector_impl_data._M_start);
          if (pvVar8 != (void *)0x0) {
            operator_delete(pvVar8,(long)header_bytes.
                                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage - (long)pvVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pub_host._M_dataplus._M_p != &pub_host.field_2) goto LAB_0020ca23;
        }
        else {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ == false) {
            pub_host._M_dataplus._M_p = (pointer)&pub_host.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&pub_host,"miniros.subscription","");
            console::initializeLogLocation
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,&pub_host,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pub_host._M_dataplus._M_p != &pub_host.field_2) {
              operator_delete(pub_host._M_dataplus._M_p,pub_host.field_2._M_allocated_capacity + 1);
            }
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x21c,
                           "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                           ,
                           "publisher implements UDPROS, but the parameters aren\'t string,int,int,int,base64"
                          );
          }
          if (peVar6 != (element_type *)0x0) {
            (*(peVar6->super_Transport)._vptr_Transport[8])(peVar6);
          }
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          pub_host._M_dataplus._M_p = (pointer)&pub_host.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&pub_host,"miniros.subscription","");
          console::initializeLogLocation
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,&pub_host,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pub_host._M_dataplus._M_p != &pub_host.field_2) {
            operator_delete(pub_host._M_dataplus._M_p,pub_host.field_2._M_allocated_capacity + 1);
          }
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc,Debug);
          console::checkLogLocationEnabled
                    (&pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_,
                         pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x251,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"Publisher offered unsupported transport [%s]",proto_name._M_dataplus._M_p
                        );
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)proto_name._M_dataplus._M_p != &proto_name.field_2) {
      operator_delete(proto_name._M_dataplus._M_p,proto_name.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (pendingConnectionDone::loc.initialized_ == false) {
      proto_name._M_dataplus._M_p = (pointer)&proto_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&proto_name,"miniros.subscription","");
      console::initializeLogLocation(&pendingConnectionDone::loc,&proto_name,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)proto_name._M_dataplus._M_p != &proto_name.field_2) {
        operator_delete(proto_name._M_dataplus._M_p,proto_name.field_2._M_allocated_capacity + 1);
      }
    }
    if (pendingConnectionDone::loc.level_ != Debug) {
      console::setLogLocationLevel(&pendingConnectionDone::loc,Debug);
      console::checkLogLocationEnabled(&pendingConnectionDone::loc);
    }
    if (pendingConnectionDone::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,pendingConnectionDone::loc.logger_,
                     pendingConnectionDone::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0x1d5,
                     "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                     ,"Failed to contact publisher [%s:%d] for topic [%s]",
                     peer_host._M_dataplus._M_p,(ulong)uVar1,(this->name_)._M_dataplus._M_p);
    }
LAB_0020c20d:
    if (peVar6 != (element_type *)0x0) {
      (*(peVar6->super_Transport)._vptr_Transport[8])(peVar6);
    }
  }
  XmlRpc::XmlRpcValue::invalidate(&proto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)xmlrpc_uri._M_dataplus._M_p != &xmlrpc_uri.field_2) {
    operator_delete(xmlrpc_uri._M_dataplus._M_p,xmlrpc_uri.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)peer_host._M_dataplus._M_p != &peer_host.field_2) {
    operator_delete(peer_host._M_dataplus._M_p,peer_host.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0020c29f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutdown_mutex_);
  return;
}

Assistant:

void Subscription::pendingConnectionDone(const PendingConnectionPtr& conn, XmlRpcValue& result)
{
  std::scoped_lock<std::mutex> lock(shutdown_mutex_);
  if (shutting_down_ || dropped_)
  {
    return;
  }

  {
    std::scoped_lock<std::mutex> pending_connections_lock(pending_connections_mutex_);
    pending_connections_.erase(conn);
  }

  TransportUDPPtr udp_transport;

  std::string peer_host = conn->getClient()->getHost();
  uint32_t peer_port = conn->getClient()->getPort();
  std::stringstream ss;
  ss << "http://" << peer_host << ":" << peer_port << "/";
  std::string xmlrpc_uri = ss.str();
  udp_transport = conn->getUDPTransport();

  XmlRpc::XmlRpcValue proto;
  if(!RPCManager::instance()->validateXmlrpcResponse("requestTopic", result, proto))
  {
  	MINIROS_DEBUG("Failed to contact publisher [%s:%d] for topic [%s]",
              peer_host.c_str(), peer_port, name_.c_str());
  	closeTransport(udp_transport);
  	return;
  }

  if (proto.size() == 0)
  {
  	MINIROS_DEBUG("Couldn't agree on any common protocols with [%s] for topic [%s]", xmlrpc_uri.c_str(), name_.c_str());
  	closeTransport(udp_transport);
  	return;
  }

  if (proto.getType() != XmlRpcValue::TypeArray)
  {
  	MINIROS_DEBUG("Available protocol info returned from %s is not a list.", xmlrpc_uri.c_str());
  	closeTransport(udp_transport);
  	return;
  }
  if (proto[0].getType() != XmlRpcValue::TypeString)
  {
  	MINIROS_DEBUG("Available protocol info list doesn't have a string as its first element.");
  	closeTransport(udp_transport);
  	return;
  }

  std::string proto_name = proto[0];
  if (proto_name == "TCPROS")
  {
    if (proto.size() != 3 ||
        proto[1].getType() != XmlRpcValue::TypeString ||
        proto[2].getType() != XmlRpcValue::TypeInt)
    {
        MINIROS_DEBUG("publisher implements TCPROS, but the " \
                "parameters aren't string,int");
      return;
    }
    std::string pub_host = proto[1];
    int pub_port = proto[2];
    MINIROS_DEBUG("Connecting via tcpros to topic [%s] at host [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);

    TransportTCPPtr transport(std::make_shared<TransportTCP>(&PollManager::instance()->getPollSet()));
    if (transport->connect(pub_host, pub_port))
    {
      ConnectionPtr connection(std::make_shared<Connection>());
      TransportPublisherLinkPtr pub_link(std::make_shared<TransportPublisherLink>(shared_from_this(), xmlrpc_uri, transport_hints_));

      connection->initialize(transport, false, HeaderReceivedFunc());
      pub_link->initialize(connection);

      ConnectionManager::instance()->addConnection(connection);

      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      addPublisherLink(pub_link);

      MINIROS_DEBUG("Connected to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
    else
    {
      MINIROS_DEBUG("Failed to connect to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
  }
  else if (proto_name == "UDPROS")
  {
    if (proto.size() != 6 ||
        proto[1].getType() != XmlRpcValue::TypeString ||
        proto[2].getType() != XmlRpcValue::TypeInt ||
        proto[3].getType() != XmlRpcValue::TypeInt ||
        proto[4].getType() != XmlRpcValue::TypeInt ||
        proto[5].getType() != XmlRpcValue::TypeBase64)
    {
      MINIROS_DEBUG("publisher implements UDPROS, but the " \
	    	       "parameters aren't string,int,int,int,base64");
      closeTransport(udp_transport);
      return;
    }
    std::string pub_host = proto[1];
    int pub_port = proto[2];
    int conn_id = proto[3];
    int max_datagram_size = proto[4];
    std::vector<char> header_bytes = proto[5];
    std::shared_ptr<uint8_t[]> buffer(new uint8_t[header_bytes.size()]);
    memcpy(buffer.get(), &header_bytes[0], header_bytes.size());
    Header h;
    std::string err;
    if (!h.parse(buffer, header_bytes.size(), err))
    {
      MINIROS_DEBUG("Unable to parse UDPROS connection header: %s", err.c_str());
      closeTransport(udp_transport);
      return;
    }
    MINIROS_DEBUG("Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]", name_.c_str(), pub_host.c_str(), pub_port, conn_id, max_datagram_size);

    std::string error_msg;
    if (h.getValue("error", error_msg))
    {
      MINIROS_DEBUG("Received error message in header for connection to [%s]: [%s]", xmlrpc_uri.c_str(), error_msg.c_str());
      closeTransport(udp_transport);
      return;
    }

    TransportPublisherLinkPtr pub_link(std::make_shared<TransportPublisherLink>(shared_from_this(), xmlrpc_uri, transport_hints_));
    if (pub_link->setHeader(h))
    {
      ConnectionPtr connection(std::make_shared<Connection>());
      connection->initialize(udp_transport, false, NULL);
      connection->setHeader(h);
      pub_link->initialize(connection);

      ConnectionManager::instance()->addConnection(connection);

      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      addPublisherLink(pub_link);

      MINIROS_DEBUG("Connected to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
    else
    {
      MINIROS_DEBUG("Failed to connect to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
      closeTransport(udp_transport);
      return;
    }
  }
  else
  {
  	MINIROS_DEBUG("Publisher offered unsupported transport [%s]", proto_name.c_str());
  }
}